

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Type * __thiscall
soul::AST::BinaryOperator::getResultType(Type *__return_storage_ptr__,BinaryOperator *this)

{
  BinaryOperator *this_local;
  
  resolveOpTypes(this);
  Type::Type(__return_storage_ptr__,&(this->resolvedOpTypes).resultType);
  return __return_storage_ptr__;
}

Assistant:

Type getResultType() const override         { resolveOpTypes(); return resolvedOpTypes.resultType; }